

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O0

void __thiscall lzham::lzcompressor::clear(lzcompressor *this)

{
  state *this_00;
  symbol_codec *in_RDI;
  uint j;
  parse_thread_state *parse_state;
  uint i;
  uint local_24;
  state *in_stack_ffffffffffffffe0;
  uint local_14;
  
  symbol_codec::clear(in_RDI);
  in_RDI[0x24].m_pDecode_need_bytes_func = (need_bytes_func_ptr)0x0;
  *(undefined4 *)&in_RDI[0x24].m_pDecode_private_data = 1;
  vector<unsigned_char>::clear((vector<unsigned_char> *)in_RDI);
  vector<unsigned_char>::clear((vector<unsigned_char> *)in_RDI);
  *(undefined4 *)&in_RDI[0x56].m_pDecode_buf = 0;
  *(undefined1 *)((long)&in_RDI[0x56].m_pDecode_buf_next + 4) = 0;
  *(undefined1 *)((long)&in_RDI[0x56].m_pDecode_buf_next + 5) = 0;
  *(undefined4 *)((long)&in_RDI[0x56].m_pDecode_buf + 4) = 0;
  *(undefined4 *)&in_RDI[0x56].m_pDecode_buf_next = 0;
  state::clear(in_stack_ffffffffffffffe0);
  in_RDI[0x136].m_bit_count = 0;
  in_RDI[0x895b].m_pDecode_buf = (uint8 *)0x0;
  for (local_14 = 0; local_14 < 8; local_14 = local_14 + 1) {
    this_00 = (state *)((long)in_RDI + (ulong)local_14 * 0xb2b00 + 0xcbb8);
    state::clear(this_00);
    for (local_24 = 0; local_24 < 0xc01; local_24 = local_24 + 1) {
      *(undefined4 *)((long)&this_00[1].super_state_base + (ulong)local_24 * 0xe8 + 8) = 0;
    }
    (this_00->super_state_base).m_cur_ofs = 0;
    (this_00->super_state_base).m_cur_state = 0;
    vector<lzham::lzcompressor::lzdecision>::clear
              ((vector<lzham::lzcompressor::lzdecision> *)in_RDI);
    this_00[0x26].m_delta_lit_table[0x2e].m_unused_alignment[0x21] = '\0';
    this_00[0x26].m_delta_lit_table[0x2e].m_unused_alignment[0x20] = '\0';
    this_00[0x26].m_delta_lit_table[0x2e].m_unused_alignment[0x22] = '\0';
  }
  return;
}

Assistant:

void lzcompressor::clear()
   {
      m_codec.clear();
      m_src_size = 0;
      m_src_adler32 = cInitAdler32;
      m_block_buf.clear();
      m_comp_buf.clear();

      m_step = 0;
      m_finished = false;
      m_use_task_pool = false;
      m_block_start_dict_ofs = 0;
      m_block_index = 0;
      m_state.clear();
      m_num_parse_threads = 0;
      m_parse_jobs_remaining = 0;

      for (uint i = 0; i < cMaxParseThreads; i++)
      {
         parse_thread_state &parse_state = m_parse_thread_state[i];
         parse_state.m_approx_state.clear();

         for (uint j = 0; j <= cMaxParseGraphNodes; j++)
            parse_state.m_nodes[j].clear();

         parse_state.m_start_ofs = 0;
         parse_state.m_bytes_to_match = 0;
         parse_state.m_best_decisions.clear();
         parse_state.m_issued_reset_state_partial = false;
         parse_state.m_emit_decisions_backwards = false;
         parse_state.m_failed = false;
      }
   }